

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

Object * env_arr_get(Object *__return_storage_ptr__,char *identifer,int line,long index,
                    Environment *env)

{
  Object *pOVar1;
  anon_union_8_4_50a03f35_for_Literal_2 *paVar2;
  char ***pppcVar3;
  undefined8 *puVar4;
  Object *pOVar5;
  Instance *pIVar6;
  anon_union_8_4_50a03f35_for_Literal_2 aVar7;
  anon_union_8_4_50a03f35_for_Literal_2 aVar8;
  char **ppcVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ObjectType OVar12;
  undefined4 uVar13;
  Record *pRVar14;
  char *__format;
  
  pRVar14 = env_match(identifer,env);
  if (env == (Environment *)0x0) {
    __format = "\x1b[31m\n[Runtime Error] [Line:%d] Undefined array %s!\x1b[0m";
  }
  else {
    if ((pRVar14->object).type == OBJECT_ARRAY) goto LAB_00106821;
    __format = 
    "\x1b[31m\n[Runtime Error] [Line:%d] Subscripted variable %s is not an array or string!\x1b[0m";
  }
  printf(__format,(ulong)(uint)line,identifer);
  stop();
LAB_00106821:
  if ((index < 1) || ((pRVar14->object).field_1.literal.line < index)) {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Array index out of range [%ld]!\x1b[0m",
           (ulong)(uint)line,index);
    stop();
  }
  pOVar5 = (pRVar14->object).field_1.arr.values;
  pOVar1 = pOVar5 + index + -1;
  OVar12 = pOVar1->type;
  uVar13 = *(undefined4 *)&pOVar1->field_0x4;
  pIVar6 = (pOVar1->field_1).instance;
  paVar2 = &pOVar5[index + -1].field_1.literal.field_2;
  aVar7 = *paVar2;
  aVar8 = paVar2[1];
  pppcVar3 = &pOVar5[index + -1].field_1.routine.arguments;
  ppcVar9 = *pppcVar3;
  uVar10 = pppcVar3[1];
  puVar4 = (undefined8 *)((long)&pOVar5[index + -1].field_1 + 0x28);
  uVar11 = puVar4[1];
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = *puVar4;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar11;
  (__return_storage_ptr__->field_1).routine.arguments = ppcVar9;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = uVar10;
  (__return_storage_ptr__->field_1).literal.field_2 = aVar7;
  *(anon_union_8_4_50a03f35_for_Literal_2 *)((long)&__return_storage_ptr__->field_1 + 0x10) = aVar8;
  __return_storage_ptr__->type = OVar12;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar13;
  (__return_storage_ptr__->field_1).instance = pIVar6;
  return __return_storage_ptr__;
}

Assistant:

Object env_arr_get(char *identifer, int line, long index, Environment *env){ 
    Record *get = env_match(identifer, env);
    if(env == NULL){
        printf(runtime_error("Undefined array %s!"), line, identifer);
        stop();
    }
    else if(get->object.type != OBJECT_ARRAY){
        printf(runtime_error("Subscripted variable %s is not an array or string!"), line, identifer);
        stop();
    }
    if(index < 1 || get->object.arr.count < index){
        printf(runtime_error("Array index out of range [%ld]!"), line, index);
        stop();
    }
    return get->object.arr.values[index - 1];
}